

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

bool __thiscall DOptionMenu::MenuEvent(DOptionMenu *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FOptionMenuItem **ppFVar4;
  int iVar5;
  float volume;
  FSoundID local_38;
  int local_34;
  int local_30;
  int pagesize;
  int maxitems;
  int rowheight;
  int y;
  int startedAt;
  bool fromcontroller_local;
  DOptionMenu *pDStack_18;
  int mkey_local;
  DOptionMenu *this_local;
  
  rowheight = this->mDesc->mSelectedItem;
  y._3_1_ = fromcontroller;
  startedAt = mkey;
  pDStack_18 = this;
  switch(mkey) {
  case 0:
    if (this->mDesc->mSelectedItem == -1) {
      iVar5 = FirstSelectable(this);
      this->mDesc->mSelectedItem = iVar5;
    }
    else {
      do {
        this->mDesc->mSelectedItem = this->mDesc->mSelectedItem + -1;
        if ((0 < this->mDesc->mScrollPos) &&
           (this->mDesc->mSelectedItem <= this->mDesc->mScrollTop + this->mDesc->mScrollPos)) {
          iVar5 = MAX<int>((this->mDesc->mSelectedItem - this->mDesc->mScrollTop) + -1,0);
          this->mDesc->mScrollPos = iVar5;
        }
        if (this->mDesc->mSelectedItem < 0) {
          maxitems = this->mDesc->mPosition;
          if (maxitems < 1) {
            if ((BigFont == (FFont *)0x0) ||
               (bVar1 = FString::IsNotEmpty(&this->mDesc->mTitle), iVar5 = maxitems, !bVar1)) {
              maxitems = -maxitems;
            }
            else {
              iVar2 = FFont::GetHeight(BigFont);
              maxitems = iVar2 - iVar5;
            }
          }
          maxitems = CleanYfac_1 * maxitems;
          pagesize = OptionSettings.mLinespacing * CleanYfac_1;
          iVar5 = DCanvas::GetHeight((DCanvas *)screen);
          local_30 = ((iVar5 - pagesize) - maxitems) / pagesize + 1;
          uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                            (&(this->mDesc->mItems).
                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
          iVar5 = MAX<int>(0,(uVar3 - local_30) + this->mDesc->mScrollTop);
          this->mDesc->mScrollPos = iVar5;
          uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                            (&(this->mDesc->mItems).
                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
          this->mDesc->mSelectedItem = uVar3 - 1;
        }
        ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                            (&(this->mDesc->mItems).
                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                             (long)this->mDesc->mSelectedItem);
        uVar3 = (*((*ppFVar4)->super_FListMenuItem)._vptr_FListMenuItem[5])();
        bVar1 = false;
        if ((uVar3 & 1) == 0) {
          bVar1 = this->mDesc->mSelectedItem != rowheight;
        }
      } while (bVar1);
    }
    break;
  case 1:
    if (this->mDesc->mSelectedItem == -1) {
      iVar5 = FirstSelectable(this);
      this->mDesc->mSelectedItem = iVar5;
    }
    else {
      do {
        this->mDesc->mSelectedItem = this->mDesc->mSelectedItem + 1;
        if (((this->CanScrollDown & 1U) != 0) && (this->mDesc->mSelectedItem == this->VisBottom)) {
          this->mDesc->mScrollPos = this->mDesc->mScrollPos + 1;
          this->VisBottom = this->VisBottom + 1;
        }
        iVar5 = this->mDesc->mSelectedItem;
        uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                          (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                          );
        if ((int)uVar3 <= iVar5) {
          if (rowheight == -1) {
            this->mDesc->mSelectedItem = -1;
            this->mDesc->mScrollPos = -1;
            break;
          }
          this->mDesc->mSelectedItem = 0;
          this->mDesc->mScrollPos = 0;
        }
        ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                            (&(this->mDesc->mItems).
                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                             (long)this->mDesc->mSelectedItem);
        uVar3 = (*((*ppFVar4)->super_FListMenuItem)._vptr_FListMenuItem[5])();
        bVar1 = false;
        if ((uVar3 & 1) == 0) {
          bVar1 = this->mDesc->mSelectedItem != rowheight;
        }
      } while (bVar1);
    }
    break;
  case 4:
    if (0 < this->mDesc->mScrollPos) {
      this->mDesc->mScrollPos =
           this->mDesc->mScrollPos -
           ((this->VisBottom - this->mDesc->mScrollPos) - this->mDesc->mScrollTop);
      if (this->mDesc->mScrollPos < 0) {
        this->mDesc->mScrollPos = 0;
      }
      if (this->mDesc->mSelectedItem != -1) {
        this->mDesc->mSelectedItem = this->mDesc->mScrollTop + this->mDesc->mScrollPos + 1;
        while( true ) {
          ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                              (&(this->mDesc->mItems).
                                super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                               (long)this->mDesc->mSelectedItem);
          iVar5 = (*((*ppFVar4)->super_FListMenuItem)._vptr_FListMenuItem[5])();
          if ((((byte)iVar5 ^ 0xff) & 1) == 0) break;
          iVar5 = this->mDesc->mSelectedItem + 1;
          this->mDesc->mSelectedItem = iVar5;
          uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                            (&(this->mDesc->mItems).
                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
          if ((int)uVar3 <= iVar5) {
            this->mDesc->mSelectedItem = 0;
          }
        }
        if (this->mDesc->mSelectedItem < this->mDesc->mScrollPos) {
          this->mDesc->mScrollPos = this->mDesc->mSelectedItem;
        }
      }
    }
    break;
  case 5:
    if ((this->CanScrollDown & 1U) != 0) {
      local_34 = (this->VisBottom - this->mDesc->mScrollPos) - this->mDesc->mScrollTop;
      this->mDesc->mScrollPos = local_34 + this->mDesc->mScrollPos;
      iVar5 = this->mDesc->mScrollPos + this->mDesc->mScrollTop + local_34;
      uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                        (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
      if ((int)uVar3 < iVar5) {
        uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                          (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                          );
        this->mDesc->mScrollPos = (uVar3 - this->mDesc->mScrollTop) - local_34;
      }
      if (this->mDesc->mSelectedItem != -1) {
        this->mDesc->mSelectedItem = this->mDesc->mScrollTop + this->mDesc->mScrollPos;
        while( true ) {
          ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                              (&(this->mDesc->mItems).
                                super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                               (long)this->mDesc->mSelectedItem);
          iVar5 = (*((*ppFVar4)->super_FListMenuItem)._vptr_FListMenuItem[5])();
          if ((((byte)iVar5 ^ 0xff) & 1) == 0) break;
          iVar5 = this->mDesc->mSelectedItem + 1;
          this->mDesc->mSelectedItem = iVar5;
          uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                            (&(this->mDesc->mItems).
                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
          if ((int)uVar3 <= iVar5) {
            this->mDesc->mSelectedItem = 0;
          }
        }
        if (this->mDesc->mSelectedItem < this->mDesc->mScrollPos) {
          this->mDesc->mScrollPos = this->mDesc->mSelectedItem;
        }
      }
    }
    break;
  case 6:
    if (-1 < this->mDesc->mSelectedItem) {
      ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                           ,(long)this->mDesc->mSelectedItem);
      uVar3 = (*((*ppFVar4)->super_FListMenuItem)._vptr_FListMenuItem[6])();
      if ((uVar3 & 1) != 0) {
        return true;
      }
    }
  default:
    if (-1 < this->mDesc->mSelectedItem) {
      ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                           ,(long)this->mDesc->mSelectedItem);
      uVar3 = (*((*ppFVar4)->super_FListMenuItem)._vptr_FListMenuItem[0xd])
                        (*ppFVar4,(ulong)(uint)startedAt,(ulong)y._3_1_ & 1);
      if ((uVar3 & 1) != 0) {
        return true;
      }
    }
    bVar1 = DMenu::MenuEvent(&this->super_DMenu,startedAt,(bool)(y._3_1_ & 1));
    return bVar1;
  }
  if (this->mDesc->mSelectedItem != rowheight) {
    FSoundID::FSoundID(&local_38,"menu/cursor");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_38,volume,0.0);
  }
  return true;
}

Assistant:

bool DOptionMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int startedAt = mDesc->mSelectedItem;

	switch (mkey)
	{
	case MKEY_Up:
		if (mDesc->mSelectedItem == -1)
		{
			mDesc->mSelectedItem = FirstSelectable();
			break;
		}
		do
		{
			--mDesc->mSelectedItem;

			if (mDesc->mScrollPos > 0 &&
				mDesc->mSelectedItem <= mDesc->mScrollTop + mDesc->mScrollPos)
			{
				mDesc->mScrollPos = MAX(mDesc->mSelectedItem - mDesc->mScrollTop - 1, 0);
			}

			if (mDesc->mSelectedItem < 0) 
			{
				// Figure out how many lines of text fit on the menu
				int y = mDesc->mPosition;

				if (y <= 0)
				{
					if (BigFont && mDesc->mTitle.IsNotEmpty())
					{
						y = -y + BigFont->GetHeight();
					}
					else
					{
						y = -y;
					}
				}
				y *= CleanYfac_1;
				int	rowheight = OptionSettings.mLinespacing * CleanYfac_1;
				int maxitems = (screen->GetHeight() - rowheight - y) / rowheight + 1;

				mDesc->mScrollPos = MAX (0, (int)mDesc->mItems.Size() - maxitems + mDesc->mScrollTop);
				mDesc->mSelectedItem = mDesc->mItems.Size()-1;
			}
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		break;

	case MKEY_Down:
		if (mDesc->mSelectedItem == -1)
		{
			mDesc->mSelectedItem = FirstSelectable();
			break;
		}
		do
		{
			++mDesc->mSelectedItem;
			
			if (CanScrollDown && mDesc->mSelectedItem == VisBottom)
			{
				mDesc->mScrollPos++;
				VisBottom++;
			}
			if (mDesc->mSelectedItem >= (int)mDesc->mItems.Size()) 
			{
				if (startedAt == -1)
				{
					mDesc->mSelectedItem = -1;
					mDesc->mScrollPos = -1;
					break;
				}
				else
				{
					mDesc->mSelectedItem = 0;
					mDesc->mScrollPos = 0;
				}
			}
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		break;

	case MKEY_PageUp:
		if (mDesc->mScrollPos > 0)
		{
			mDesc->mScrollPos -= VisBottom - mDesc->mScrollPos - mDesc->mScrollTop;
			if (mDesc->mScrollPos < 0)
			{
				mDesc->mScrollPos = 0;
			}
			if (mDesc->mSelectedItem != -1)
			{
				mDesc->mSelectedItem = mDesc->mScrollTop + mDesc->mScrollPos + 1;
				while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable())
				{
					if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size())
					{
						mDesc->mSelectedItem = 0;
					}
				}
				if (mDesc->mScrollPos > mDesc->mSelectedItem)
				{
					mDesc->mScrollPos = mDesc->mSelectedItem;
				}
			}
		}
		break;

	case MKEY_PageDown:
		if (CanScrollDown)
		{
			int pagesize = VisBottom - mDesc->mScrollPos - mDesc->mScrollTop;
			mDesc->mScrollPos += pagesize;
			if (mDesc->mScrollPos + mDesc->mScrollTop + pagesize > (int)mDesc->mItems.Size())
			{
				mDesc->mScrollPos = mDesc->mItems.Size() - mDesc->mScrollTop - pagesize;
			}
			if (mDesc->mSelectedItem != -1)
			{
				mDesc->mSelectedItem = mDesc->mScrollTop + mDesc->mScrollPos;
				while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable())
				{
					if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size())
					{
						mDesc->mSelectedItem = 0;
					}
				}
				if (mDesc->mScrollPos > mDesc->mSelectedItem)
				{
					mDesc->mScrollPos = mDesc->mSelectedItem;
				}
			}
		}
		break;

	case MKEY_Enter:
		if (mDesc->mSelectedItem >= 0 && mDesc->mItems[mDesc->mSelectedItem]->Activate()) 
		{
			return true;
		}
		// fall through to default
	default:
		if (mDesc->mSelectedItem >= 0 && 
			mDesc->mItems[mDesc->mSelectedItem]->MenuEvent(mkey, fromcontroller)) return true;
		return Super::MenuEvent(mkey, fromcontroller);
	}

	if (mDesc->mSelectedItem != startedAt)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
	}
	return true;
}